

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall pfederc::LoopExpr::~LoopExpr(LoopExpr *this)

{
  LoopExpr *this_local;
  
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            (&this->bodyExpr);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&this->itExpr);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&this->condExpr);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&this->initExpr);
  Expr::~Expr(&this->super_Expr);
  return;
}

Assistant:

LoopExpr::~LoopExpr() {
}